

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue-C-API.cpp
# Opt level: O1

void llb_build_value_get_stale_file_list
               (llb_build_value *value,void *context,_func_void_void_ptr_llb_data_t *iterator)

{
  char *pcVar1;
  llb_data_t lVar2;
  pointer pSVar3;
  llb_data_t data;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> stringList;
  llb_data_t local_78;
  char *local_68;
  undefined8 local_60;
  char local_58;
  undefined7 uStack_57;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_48;
  
  llbuild::buildsystem::BuildValue::getStaleFileList(&local_48,(BuildValue *)value);
  if (local_48.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pSVar3 = local_48.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      pcVar1 = pSVar3->Data;
      local_78.length = pSVar3->Length;
      local_68 = &local_58;
      if (pcVar1 == (char *)0x0) {
        local_60 = 0;
        local_58 = '\0';
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,pcVar1,pcVar1 + local_78.length);
      }
      pcVar1 = local_68;
      local_78.data = (uint8_t *)strdup(local_68);
      if (pcVar1 != &local_58) {
        operator_delete(pcVar1,CONCAT71(uStack_57,local_58) + 1);
      }
      lVar2.data = local_78.data;
      lVar2.length = local_78.length;
      (*iterator)(context,lVar2);
      llb_data_destroy(&local_78);
      pSVar3 = pSVar3 + 1;
    } while (pSVar3 != local_48.
                       super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl
                       .super__Vector_impl_data._M_finish);
  }
  if (local_48.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void llb_build_value_get_stale_file_list(llb_build_value *_Nonnull value, void *_Nullable context, void(*_Nonnull iterator)(void *_Nullable context, llb_data_t data)) {
  auto stringList = ((CAPIBuildValue *)value)->getInternalBuildValue().getStaleFileList();
  for (auto string: stringList) {
    llb_data_t data;
    data.length = string.size();
    data.data = (uint8_t *)strdup(string.str().c_str());
    iterator(context, data);
    llb_data_destroy(&data);
  }
}